

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall State::update(State *this)

{
  bool bVar1;
  float fVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  ImGuiIO *utf8_chars;
  long lVar6;
  reference pIVar7;
  ImGuiIO *in_RDI;
  double dVar8;
  InputEvent *event;
  iterator __end2;
  iterator __begin2;
  vector<State::InputEvent,_std::allocator<State::InputEvent>_> *__range2;
  ImGuiIO *io;
  iterator client;
  int k;
  map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
  *in_stack_ffffffffffffff68;
  ImGuiIO *in_stack_ffffffffffffff70;
  ImGuiIO *in_stack_ffffffffffffff78;
  ImGuiIO *in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  char local_61;
  key_type *in_stack_ffffffffffffffa8;
  __normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
  in_stack_ffffffffffffffb0;
  _Self local_28;
  _Self local_20;
  _Self local_18;
  _Self local_10 [2];
  
  sVar3 = std::
          map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
          ::size((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                  *)0x10e005);
  local_61 = '\0';
  if (sVar3 != 0) {
    local_10[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type *)0x10e029);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator==(local_10,&local_18);
    in_stack_ffffffffffffff8c = (float)CONCAT13(1,SUB43(in_stack_ffffffffffffff8c,0));
    if (!bVar1) {
      dVar8 = ImGui::GetTime();
      in_stack_ffffffffffffff8c =
           (float)CONCAT13((double)(in_RDI->DisplaySize).x < dVar8,
                           SUB43(in_stack_ffffffffffffff8c,0));
    }
    local_61 = (char)((uint)in_stack_ffffffffffffff8c >> 0x18);
  }
  if (local_61 != '\0') {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type *)0x10e0b1);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (bVar1) {
      pmVar4 = std::
               map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
               ::operator[]((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                             *)in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8);
      pmVar4->hasControl = false;
    }
    fVar2 = (float)((int)(in_RDI->DisplaySize).y + 1);
    (in_RDI->DisplaySize).y = fVar2;
    in_stack_ffffffffffffff80 = (ImGuiIO *)(long)(int)fVar2;
    std::
    map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
    ::size((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
            *)0x10e114);
    std::
    map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
    ::begin(in_stack_ffffffffffffff68);
    std::advance<std::_Rb_tree_iterator<std::pair<int_const,State::ClientData>>,int>
              ((_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_> *)in_RDI,
               (int)in_stack_ffffffffffffff8c);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_> *)0x10e152);
    (ppVar5->second).hasControl = true;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_> *)0x10e160);
    in_RDI->DeltaTime = (float)ppVar5->first;
    dVar8 = ImGui::GetTime();
    (in_RDI->DisplaySize).x = (float)(dVar8 + (double)(float)in_RDI->BackendFlags);
    ImGui::GetIO();
    ImGuiIO::ClearInputKeys(in_stack_ffffffffffffff70);
  }
  sVar3 = std::
          map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
          ::size((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                  *)0x10e1a8);
  if (sVar3 == 0) {
    in_RDI->DeltaTime = -NAN;
  }
  if (0 < (int)in_RDI->DeltaTime) {
    utf8_chars = ImGui::GetIO();
    lVar6 = std::__cxx11::string::size();
    if (lVar6 != 0) {
      std::__cxx11::string::c_str();
      ImGuiIO::AddInputCharactersUTF8(in_stack_ffffffffffffff80,(char *)utf8_chars);
      in_stack_ffffffffffffff78 = utf8_chars;
    }
    std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::begin
              ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
               in_stack_ffffffffffffff68);
    std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::end
              ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)
               in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      pIVar7 = __gnu_cxx::
               __normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
               ::operator*((__normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
                            *)&stack0xffffffffffffffb0);
      in_stack_ffffffffffffff70 = (ImGuiIO *)(ulong)pIVar7->type;
      switch(in_stack_ffffffffffffff70) {
      case (ImGuiIO *)0x0:
        ImGuiIO::AddKeyEvent
                  (in_stack_ffffffffffffff80,(ImGuiKey)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
        break;
      case (ImGuiIO *)0x1:
        ImGuiIO::AddMousePosEvent(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        break;
      case (ImGuiIO *)0x2:
        ImGuiIO::AddMouseButtonEvent
                  (in_RDI,(int)in_stack_ffffffffffffff8c,
                   SUB41((uint)in_stack_ffffffffffffff88 >> 0x18,0));
        ImGuiIO::AddMousePosEvent(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        break;
      case (ImGuiIO *)0x3:
        ImGuiIO::AddMouseWheelEvent(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      }
      __gnu_cxx::
      __normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
      ::operator++((__normal_iterator<State::InputEvent_*,_std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>_>
                    *)&stack0xffffffffffffffb0);
    }
    std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::clear
              ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)0x10e347);
    std::__cxx11::string::operator=((string *)&in_RDI->DisplayFramebufferScale,"");
  }
  return;
}

Assistant:

void State::update() {
    if (clients.size() > 0 && (clients.find(curIdControl) == clients.end() || ImGui::GetTime() > tControlNext_s)) {
        if (clients.find(curIdControl) != clients.end()) {
            clients[curIdControl].hasControl = false;
        }
        int k = ++controlIteration % clients.size();
        auto client = clients.begin();
        std::advance(client, k);
        client->second.hasControl = true;
        curIdControl = client->first;
        tControlNext_s = ImGui::GetTime() + tControl_s;
        ImGui::GetIO().ClearInputKeys();
    }

    if (clients.size() == 0) {
        curIdControl = -1;
    }

    if (curIdControl > 0) {
        {
            auto & io = ImGui::GetIO();

            if (lastAddText.size() > 0) {
                io.AddInputCharactersUTF8(lastAddText.c_str());
            }

            for (const auto & event : inputEvents) {
                switch (event.type) {
                    case InputEvent::Type::EKey:
                        {
                            io.AddKeyEvent(event.key, event.isDown);
                        } break;
                    case InputEvent::Type::EMousePos:
                        {
                            io.AddMousePosEvent(event.mousePos.x, event.mousePos.y);
                        } break;
                    case InputEvent::Type::EMouseButton:
                        {
                            io.AddMouseButtonEvent(event.mouseButton, event.isDown);
                            io.AddMousePosEvent(event.mousePos.x, event.mousePos.y);
                        } break;
                    case InputEvent::Type::EMouseWheel:
                        {
                            io.AddMouseWheelEvent(event.mouseWheelX, event.mouseWheelY);
                        } break;
                };
            }
        }

        inputEvents.clear();
        lastAddText = "";
    }
}